

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_TextRange_resizeT(ImVector_TextRange *self,int new_size,TextRange v)

{
  ImGuiTextRange *pIVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = self->Capacity;
  if (iVar4 < new_size) {
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar4 <= new_size) {
      iVar4 = new_size;
    }
    pIVar1 = (ImGuiTextRange *)ImGui::MemAlloc((long)iVar4 << 4);
    if (self->Data != (ImGuiTextRange *)0x0) {
      memcpy(pIVar1,self->Data,(long)self->Size << 4);
      ImGui::MemFree(self->Data);
    }
    self->Data = pIVar1;
    self->Capacity = iVar4;
  }
  iVar4 = self->Size;
  if (iVar4 < new_size) {
    lVar3 = (long)new_size - (long)iVar4;
    uVar2 = (long)iVar4 << 4 | 8;
    do {
      pIVar1 = self->Data;
      *(char **)((long)pIVar1 + (uVar2 - 8)) = v.b;
      *(char **)((long)&pIVar1->b + uVar2) = v.e;
      uVar2 = uVar2 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_TextRange_resizeT(ImVector_TextRange* self,int new_size,const TextRange v)
{
    return self->resize(new_size,v);
}